

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_unitsNotEqualDifferingUnitsBasic_Test::Equality_unitsNotEqualDifferingUnitsBasic_Test
          (Equality_unitsNotEqualDifferingUnitsBasic_Test *this)

{
  Equality_unitsNotEqualDifferingUnitsBasic_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Equality_unitsNotEqualDifferingUnitsBasic_Test_00149a08;
  return;
}

Assistant:

TEST(Equality, unitsNotEqualDifferingUnitsBasic)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second", 1.0, "unit_id");
    u2->addUnit("second", 2.0, "unit_id");

    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
}